

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O3

SubroutineSymbol * __thiscall
slang::ast::MethodPrototypeSymbol::getSubroutine(MethodPrototypeSymbol *this)

{
  SyntaxKind SVar1;
  Scope *parent;
  Symbol *pSVar2;
  Scope *scope;
  Compilation *this_00;
  bool bVar3;
  SourceLocation location;
  Diagnostic *pDVar4;
  Diagnostic *this_01;
  SubroutineSymbol *pSVar5;
  _Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false> syntax;
  SourceRange sourceRange;
  tuple<const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*> local_58;
  Token local_40;
  
  if ((this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged ==
      true) {
    pSVar5 = (this->subroutine).
             super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>._M_payload.
             super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload._M_value;
    if (this->needsMatchCheck != true) {
      return pSVar5;
    }
    this->needsMatchCheck = false;
    bVar3 = checkMethodMatch(this,(this->super_Symbol).parentScope,pSVar5);
    if (bVar3) {
LAB_007bd4a2:
      return (this->subroutine).
             super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>._M_payload.
             super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload._M_value;
    }
    if ((this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
        _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged ==
        false) {
      (this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged =
           true;
    }
    (this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload.
    _M_value = (SubroutineSymbol *)0x0;
  }
  else {
    (this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged = true;
    (this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload.
    _M_value = (SubroutineSymbol *)0x0;
    if ((this->super_Symbol).name._M_len != 0) {
      parent = (this->super_Symbol).parentScope;
      pSVar2 = parent->thisSym;
      scope = pSVar2->parentScope;
      this_00 = scope->compilation;
      Compilation::findOutOfBlockDecl
                (&local_58,this_00,scope,pSVar2->name,(this->super_Symbol).name);
      if (((FunctionDeclarationSyntax *)
           local_58.
           super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
           .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl ==
           (FunctionDeclarationSyntax *)0x0) ||
         ((SVar1 = (((MemberSyntax *)
                    &(local_58.
                      super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                      .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl)
                     ->kind)->super_SyntaxNode).kind, SVar1 != TaskDeclaration &&
          (SVar1 != FunctionDeclaration)))) {
        syntax._M_head_impl = (SyntaxNode *)0x0;
      }
      else {
        *(bool *)local_58.
                 super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                 .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
                 super__Tuple_impl<2UL,_bool_*>.super__Head_base<2UL,_bool_*,_false>._M_head_impl =
             true;
        syntax._M_head_impl =
             local_58.
             super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
             .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl;
      }
      if (((this->flags).m_bits & 2) == 0) {
        if ((FunctionDeclarationSyntax *)syntax._M_head_impl == (FunctionDeclarationSyntax *)0x0) {
          pDVar4 = Scope::addDiag(scope,(DiagCode)0x8b0006,(this->super_Symbol).location);
          Diagnostic::operator<<(pDVar4,(this->super_Symbol).name);
          return (SubroutineSymbol *)0x0;
        }
        if (local_58.
            super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
            .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
            super__Head_base<1UL,_slang::ast::SymbolIndex,_false>._M_head_impl <=
            pSVar2->indexInScope) {
          local_40 = slang::syntax::SyntaxNode::getLastToken
                               ((SyntaxNode *)
                                (((((FunctionDeclarationSyntax *)syntax._M_head_impl)->prototype).
                                 ptr)->name).ptr);
          location = parsing::Token::location(&local_40);
          pDVar4 = Scope::addDiag(scope,(DiagCode)0x6e0006,location);
          this_01 = Diagnostic::operator<<(pDVar4,(this->super_Symbol).name);
          Diagnostic::operator<<(this_01,pSVar2->name);
          Diagnostic::addNote(pDVar4,(DiagCode)0x50001,pSVar2->location);
        }
        pSVar5 = SubroutineSymbol::createOutOfBlock
                           (this_00,(FunctionDeclarationSyntax *)syntax._M_head_impl,this,parent,
                            scope,local_58.
                                  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                  .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
                                  super__Head_base<1UL,_slang::ast::SymbolIndex,_false>._M_head_impl
                           );
      }
      else {
        if ((FunctionDeclarationSyntax *)syntax._M_head_impl != (FunctionDeclarationSyntax *)0x0) {
          sourceRange = slang::syntax::SyntaxNode::sourceRange
                                  ((SyntaxNode *)
                                   (((((FunctionDeclarationSyntax *)syntax._M_head_impl)->prototype)
                                    .ptr)->name).ptr);
          pDVar4 = Scope::addDiag(scope,(DiagCode)0xc0006,sourceRange);
          Diagnostic::addNote(pDVar4,(DiagCode)0x50001,(this->super_Symbol).location);
          goto LAB_007bd4a2;
        }
        pSVar5 = SubroutineSymbol::createFromPrototype(this_00,this,parent);
      }
      if ((this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged
          == false) {
        (this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
        _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged =
             true;
      }
      (this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload.
      _M_value = pSVar5;
      return pSVar5;
    }
  }
  return (SubroutineSymbol *)0x0;
}

Assistant:

const SubroutineSymbol* MethodPrototypeSymbol::getSubroutine() const {
    SLANG_ASSERT(getParentScope() && getParentScope()->asSymbol().getParentScope());

    if (subroutine) {
        if (needsMatchCheck) {
            needsMatchCheck = false;
            if (!checkMethodMatch(*getParentScope(), *subroutine.value()))
                subroutine = nullptr;
        }
        return *subroutine;
    }

    subroutine = nullptr;
    if (name.empty())
        return *subroutine;

    auto& nearScope = *getParentScope();
    auto& parentSym = nearScope.asSymbol();
    auto& outerScope = *parentSym.getParentScope();
    auto& comp = outerScope.getCompilation();

    SLANG_ASSERT(!flags.has(MethodFlags::ModportImport | MethodFlags::ModportExport |
                            MethodFlags::InterfaceExtern));

    // The out-of-block definition must be in our parent scope.
    auto [declSyntax, index, used] = comp.findOutOfBlockDecl(outerScope, parentSym.name, name);
    const FunctionDeclarationSyntax* syntax = nullptr;
    if (declSyntax && (declSyntax->kind == SyntaxKind::FunctionDeclaration ||
                       declSyntax->kind == SyntaxKind::TaskDeclaration)) {
        syntax = &declSyntax->as<FunctionDeclarationSyntax>();
        *used = true;
    }

    if (flags.has(MethodFlags::Pure)) {
        // A pure method should not have a body defined.
        if (syntax) {
            auto& diag = outerScope.addDiag(diag::BodyForPure,
                                            syntax->prototype->name->sourceRange());
            diag.addNote(diag::NoteDeclarationHere, location);
        }
        else {
            // Create a stub subroutine that we can return for callers to reference.
            subroutine = &SubroutineSymbol::createFromPrototype(comp, *this, nearScope);
        }
        return *subroutine;
    }

    // Otherwise, there must be a body for any declared prototype.
    if (!syntax) {
        outerScope.addDiag(diag::NoMemberImplFound, location) << name;
        return nullptr;
    }

    // The method definition must be located after the class definition.
    if (index <= parentSym.getIndex()) {
        auto& diag = outerScope.addDiag(diag::MemberDefinitionBeforeClass,
                                        syntax->prototype->name->getLastToken().location());
        diag << name << parentSym.name;
        diag.addNote(diag::NoteDeclarationHere, parentSym.location);
    }

    subroutine = &SubroutineSymbol::createOutOfBlock(comp, *syntax, *this, nearScope, outerScope,
                                                     index);
    return *subroutine;
}